

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::InputParameter::InternalSwap(InputParameter *this,InputParameter *other)

{
  InternalMetadataWithArena *this_00;
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  UnknownFieldSet *pUVar5;
  UnknownFieldSet *pUVar6;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->shape_).super_RepeatedPtrFieldBase,&(other->shape_).super_RepeatedPtrFieldBase)
  ;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar6 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar6 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    pvVar3 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar5 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar5 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    pvVar4 = pUVar5->fields_;
    pUVar5->fields_ = pUVar6->fields_;
    pUVar6->fields_ = pvVar4;
  }
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void InputParameter::InternalSwap(InputParameter* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}